

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *v;
  float fVar1;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar2;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar3;
  pointer pVVar4;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar5;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar6;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar7;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar8;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar9;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar10;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var11;
  pointer puVar12;
  aiAnimation *paVar13;
  undefined1 auVar14 [16];
  aiNode *paVar15;
  void *__src;
  bool bVar16;
  int iVar17;
  Logger *this_00;
  pointer puVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 *__s;
  undefined8 *__s_00;
  aiNode *paVar21;
  aiVertexWeight *paVar22;
  aiMatrix4x4t<float> *paVar23;
  SharedPostProcessInfo *pSVar24;
  aiBone **__dest;
  pointer ppaVar25;
  aiVertexWeight this_01;
  pointer puVar26;
  aiMaterial **ppaVar27;
  aiMesh **ppaVar28;
  aiNodeAnim **ppaVar29;
  aiAnimation **ppaVar30;
  ulong uVar31;
  pointer ppaVar32;
  pointer puVar33;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *this_02;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *this_03;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *this_04;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *this_05;
  undefined8 *__s_01;
  long lVar34;
  B3DImporter *pBVar35;
  _Head_base<0UL,_aiMesh_*,_false> _Var36;
  long lVar37;
  long lVar38;
  SharedPostProcessInfo *pSVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  aiBone *bone;
  FlipWindingOrderProcess flip;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  MakeLeftHandedProcess makeleft;
  string t;
  aiNode *local_1b0;
  _Head_base<0UL,_aiMesh_*,_false> local_1a8;
  long local_1a0;
  FlipWindingOrderProcess local_198;
  int local_17c;
  void *local_178;
  iterator iStack_170;
  aiBone **local_168;
  vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
  *local_160;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *local_158;
  undefined8 *local_150;
  undefined1 local_148 [12];
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  *local_c0;
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  *local_b8;
  ulong local_b0;
  aiNode *local_a8;
  ulong local_a0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->_textures,
                    (this->_textures).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = puVar2;
  if (puVar3 != puVar2) {
    do {
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != puVar3);
    (this->_materials).
    super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  pVVar4 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vertices).
      super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar4) {
    (this->_vertices).
    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar4;
  }
  puVar5 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = puVar5;
  if (puVar6 != puVar5) {
    do {
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != puVar6);
    (this->_meshes).
    super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar5;
  }
  local_98 = &this->_nodes;
  DeleteAllBarePointers<aiNode*>(local_98);
  ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar25) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar25;
  }
  puVar7 = (this->_nodeAnims).
           super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (this->_nodeAnims).
           super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = puVar7;
  if (puVar8 != puVar7) {
    do {
      std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != puVar8);
    (this->_nodeAnims).
    super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  puVar9 = (this->_animations).
           super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = puVar9;
  if (puVar10 != puVar9) {
    do {
      std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != puVar10);
    (this->_animations).
    super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  ReadChunk_abi_cxx11_(&local_50,this);
  iVar17 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar17 == 0) {
    uVar40 = ReadInt(this);
    bVar16 = DefaultLogger::isNullLogger();
    if (!bVar16) {
      snprintf(local_148,0x80,"B3D file format version: %i",(ulong)uVar40);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,local_148);
    }
    puVar18 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar40 = puVar18[-1];
    if (uVar40 != this->_pos) {
      do {
        ReadChunk_abi_cxx11_((string *)local_148,this);
        iVar17 = std::__cxx11::string::compare((char *)local_148);
        if (iVar17 == 0) {
          ReadTEXS(this);
        }
        else {
          iVar17 = std::__cxx11::string::compare((char *)local_148);
          if (iVar17 == 0) {
            ReadBRUS(this);
          }
          else {
            iVar17 = std::__cxx11::string::compare((char *)local_148);
            if (iVar17 == 0) {
              ReadNODE(this,(aiNode *)0x0);
            }
          }
        }
        puVar18 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar40 = puVar18[-1];
        puVar18 = puVar18 + -1;
        this->_pos = uVar40;
        (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar18;
        if ((undefined1 *)local_148._0_8_ != local_138) {
          operator_delete((void *)local_148._0_8_,(long)local_138 + 1);
          puVar18 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar40 = this->_pos;
        }
      } while (puVar18[-1] != uVar40);
    }
  }
  else {
    puVar18 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar40 = puVar18[-1];
  }
  this->_pos = uVar40;
  (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar18 + -1;
  ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppaVar32 == ppaVar25) {
    local_70._0_8_ = local_70 + 0x10;
    pBVar35 = (B3DImporter *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar35,"No nodes","");
    Fail(pBVar35,(string *)local_70);
  }
  if ((this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90._0_8_ = local_90 + 0x10;
    pBVar35 = (B3DImporter *)local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar35,"No meshes","");
    Fail(pBVar35,(string *)local_90);
  }
  local_160 = (vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
               *)&this->_materials;
  local_158 = &this->_meshes;
  local_b8 = &this->_nodeAnims;
  local_c0 = &this->_animations;
  uVar19 = 0;
  do {
    if (ppaVar25[uVar19]->mNumMeshes != 0) {
      uVar31 = 0;
      local_b0 = uVar19;
      local_a8 = ppaVar25[uVar19];
      do {
        _Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             (local_158->
             super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[local_a8->mMeshes[uVar31]]._M_t.
             super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
        iVar17 = *(int *)((long)_Var11._M_t.
                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
        local_17c = iVar17 * 3;
        uVar19 = (ulong)local_17c;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar19;
        uVar20 = SUB168(auVar14 * ZEXT816(0xc),0);
        *(int *)((long)_Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = local_17c;
        if (SUB168(auVar14 * ZEXT816(0xc),8) != 0) {
          uVar20 = 0xffffffffffffffff;
        }
        local_a0 = uVar31;
        __s = (undefined8 *)operator_new__(uVar20);
        if (iVar17 != 0) {
          memset(__s,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(undefined8 **)
         ((long)_Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __s;
        if ((this->_vflags & 1) == 0) {
          __s_01 = (undefined8 *)0x0;
        }
        else {
          __s_01 = (undefined8 *)operator_new__(uVar20);
          if (iVar17 != 0) {
            memset(__s_01,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = __s_01;
        }
        if (this->_tcsets == 0) {
          __s_00 = (undefined8 *)0x0;
        }
        else {
          __s_00 = (undefined8 *)operator_new__(uVar20);
          if (iVar17 != 0) {
            memset(__s_00,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = __s_00;
        }
        lVar34 = *(long *)((long)_Var11._M_t.
                                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
        local_1a8._M_head_impl =
             (aiMesh *)
             _Var11._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  *)&local_198,
                 (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_148);
        if (0 < iVar17) {
          local_1a0 = 0;
          local_150 = __s_00;
          do {
            lVar38 = 0;
            do {
              uVar19 = (ulong)*(uint *)(*(long *)(lVar34 + 8) + lVar38 * 4);
              pVVar4 = (this->_vertices).
                       super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(float *)(__s + 1) = pVVar4[uVar19].vertex.z;
              *__s = *(undefined8 *)&pVVar4[uVar19].vertex;
              if (__s_01 == (undefined8 *)0x0) {
                __s_01 = (undefined8 *)0x0;
              }
              else {
                *(float *)(__s_01 + 1) = pVVar4[uVar19].normal.z;
                *__s_01 = *(undefined8 *)&pVVar4[uVar19].normal;
                __s_01 = (undefined8 *)((long)__s_01 + 0xc);
              }
              if (local_150 == (undefined8 *)0x0) {
                local_150 = (undefined8 *)0x0;
              }
              else {
                *(float *)(local_150 + 1) = pVVar4[uVar19].texcoords.z;
                *local_150 = *(undefined8 *)&pVVar4[uVar19].texcoords;
                local_150 = (undefined8 *)((long)local_150 + 0xc);
              }
              __s = (undefined8 *)((long)__s + 0xc);
              uVar40 = (int)lVar38 + (int)local_1a0;
              *(uint *)(*(long *)(lVar34 + 8) + lVar38 * 4) = uVar40;
              lVar37 = -4;
              do {
                fVar1 = *(float *)(pVVar4[uVar19 + 1].bones + lVar37 * 4 + -0x24);
                if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
                local_148._4_4_ = fVar1;
                local_148._0_4_ = uVar40;
                std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                emplace_back<aiVertexWeight>
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                           ((long)&(((PropertyMap *)local_198.super_BaseProcess._vptr_BaseProcess)->
                                   _M_t)._M_impl.field_0x0 +
                           (ulong)((uint)*(byte *)((long)pVVar4[uVar19].weights + lVar37) * 0x18)),
                           (aiVertexWeight *)local_148);
                lVar37 = lVar37 + 1;
              } while (lVar37 != 0);
              lVar38 = lVar38 + 1;
            } while (lVar38 != 3);
            lVar34 = lVar34 + 0x10;
            local_1a0 = local_1a0 + 3;
          } while ((int)local_1a0 < local_17c);
        }
        local_178 = (void *)0x0;
        iStack_170._M_current = (aiBone **)0x0;
        local_168 = (aiBone **)0x0;
        if (local_198.super_BaseProcess.shared ==
            (SharedPostProcessInfo *)local_198.super_BaseProcess._vptr_BaseProcess) {
          *(undefined4 *)((long)local_1a8._M_head_impl + 0xd8) = 0;
          *(undefined8 *)((long)local_1a8._M_head_impl + 0xe0) = 0;
        }
        else {
          uVar19 = 0;
          pSVar24 = local_198.super_BaseProcess.shared;
          _Var36._M_head_impl = local_1a8._M_head_impl;
          pSVar39 = (SharedPostProcessInfo *)local_198.super_BaseProcess._vptr_BaseProcess;
          do {
            if (*(_func_int **)
                 (&(pSVar39->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 uVar19 * 6) !=
                *(_func_int **)((long)&(pSVar39->pmap)._M_t._M_impl.field_0x0 + uVar19 * 3 * 8)) {
              paVar21 = (aiNode *)operator_new(0x450);
              (paVar21->mName).length = 0;
              (paVar21->mName).data[0] = '\0';
              memset((paVar21->mName).data + 1,0x1b,0x3ff);
              (paVar21->mTransformation).a1 = 0.0;
              (paVar21->mTransformation).a2 = 0.0;
              (paVar21->mTransformation).a3 = 0.0;
              (paVar21->mTransformation).a4 = 1.0;
              (paVar21->mTransformation).b1 = 0.0;
              (paVar21->mTransformation).b2 = 0.0;
              (paVar21->mTransformation).b3 = 0.0;
              (paVar21->mTransformation).b4 = 0.0;
              (paVar21->mTransformation).c1 = 1.0;
              (paVar21->mTransformation).c2 = 0.0;
              (paVar21->mTransformation).c3 = 0.0;
              (paVar21->mTransformation).c4 = 0.0;
              (paVar21->mTransformation).d1 = 0.0;
              (paVar21->mTransformation).d2 = 1.0;
              (paVar21->mTransformation).d3 = 0.0;
              (paVar21->mTransformation).d4 = 0.0;
              *(undefined8 *)&paVar21->field_0x444 = 0;
              *(undefined4 *)((long)&paVar21->mParent + 4) = 0x3f800000;
              local_1b0 = paVar21;
              if (iStack_170._M_current == local_168) {
                std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                          ((vector<aiBone*,std::allocator<aiBone*>> *)&local_178,iStack_170,
                           (aiBone **)&local_1b0);
              }
              else {
                *iStack_170._M_current = (aiBone *)paVar21;
                iStack_170._M_current = iStack_170._M_current + 1;
              }
              paVar15 = local_1b0;
              paVar21 = (local_98->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
              if (local_1b0 != paVar21) {
                uVar40 = (paVar21->mName).length;
                (local_1b0->mName).length = uVar40;
                memcpy((local_1b0->mName).data,(paVar21->mName).data,(ulong)uVar40);
                (paVar15->mName).data[uVar40] = '\0';
              }
              v = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                  ((long)&(pSVar39->pmap)._M_t._M_impl.field_0x0 + uVar19 * 3 * 8);
              (local_1b0->mTransformation).a1 =
                   (float)((ulong)((long)(v->
                                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(v->
                                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3);
              paVar22 = to_array<aiVertexWeight>(this,v);
              _Var36._M_head_impl = local_1a8._M_head_impl;
              *(aiVertexWeight **)&(local_1b0->mTransformation).a2 = paVar22;
              local_148._0_4_ = (paVar21->mTransformation).a1;
              local_148._4_4_ = (paVar21->mTransformation).a2;
              unique0x100009dc = *(SharedPostProcessInfo **)&(paVar21->mTransformation).a3;
              local_138 = *(undefined1 (*) [8])&(paVar21->mTransformation).b1;
              fStack_130 = (paVar21->mTransformation).b3;
              fStack_12c = (paVar21->mTransformation).b4;
              local_128 = (paVar21->mTransformation).c1;
              fStack_124 = (paVar21->mTransformation).c2;
              fStack_120 = (paVar21->mTransformation).c3;
              fStack_11c = (paVar21->mTransformation).c4;
              local_118 = (paVar21->mTransformation).d1;
              fStack_114 = (paVar21->mTransformation).d2;
              fStack_110 = (paVar21->mTransformation).d3;
              fStack_10c = (paVar21->mTransformation).d4;
              paVar21 = paVar21->mParent;
              if (paVar21 != (aiNode *)0x0) {
                fStack_13c = (float)((ulong)unique0x100009dc >> 0x20);
                local_138._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
                do {
                  fVar1 = (paVar21->mTransformation).b2;
                  fVar46 = (paVar21->mTransformation).b1;
                  fVar45 = (paVar21->mTransformation).b3;
                  fVar53 = (paVar21->mTransformation).a2;
                  fVar47 = fVar53 * (float)local_138._0_4_;
                  fVar49 = fVar53 * (float)local_138._4_4_;
                  fVar51 = fVar53 * fStack_130;
                  fVar53 = fVar53 * fStack_12c;
                  fVar58 = (paVar21->mTransformation).c2;
                  fVar55 = fVar58 * (float)local_138._0_4_;
                  fVar56 = fVar58 * (float)local_138._4_4_;
                  fVar57 = fVar58 * fStack_130;
                  fVar58 = fVar58 * fStack_12c;
                  fVar62 = (paVar21->mTransformation).d2;
                  fVar59 = fVar62 * (float)local_138._0_4_;
                  fVar60 = fVar62 * (float)local_138._4_4_;
                  fVar61 = fVar62 * fStack_130;
                  fVar62 = fVar62 * fStack_12c;
                  fVar54 = (paVar21->mTransformation).b4;
                  local_138._0_4_ =
                       fVar54 * local_118 +
                       fVar45 * local_128 +
                       fVar46 * (float)local_148._0_4_ + fVar1 * (float)local_138._0_4_;
                  local_138._4_4_ =
                       fVar54 * fStack_114 +
                       fVar45 * fStack_124 +
                       fVar46 * (float)local_148._4_4_ + fVar1 * (float)local_138._4_4_;
                  fStack_130 = fVar54 * fStack_110 +
                               fVar45 * fStack_120 +
                               fVar46 * (float)local_148._8_4_ + fVar1 * fStack_130;
                  fStack_12c = fVar54 * fStack_10c +
                               fVar45 * fStack_11c + fVar46 * fStack_13c + fVar1 * fStack_12c;
                  fVar1 = (paVar21->mTransformation).a1;
                  fVar46 = (paVar21->mTransformation).a3;
                  fVar45 = (paVar21->mTransformation).c1;
                  fVar41 = fVar45 * (float)local_148._0_4_;
                  fVar43 = fVar45 * (float)local_148._4_4_;
                  fVar44 = fVar45 * (float)local_148._8_4_;
                  fVar45 = fVar45 * fStack_13c;
                  fVar54 = (paVar21->mTransformation).d1;
                  fVar48 = fVar54 * (float)local_148._0_4_;
                  fVar50 = fVar54 * (float)local_148._4_4_;
                  fVar52 = fVar54 * (float)local_148._8_4_;
                  fVar54 = fVar54 * fStack_13c;
                  fVar42 = (paVar21->mTransformation).a4;
                  local_148._0_4_ =
                       fVar42 * local_118 +
                       fVar46 * local_128 + fVar1 * (float)local_148._0_4_ + fVar47;
                  local_148._4_4_ =
                       fVar42 * fStack_114 +
                       fVar46 * fStack_124 + fVar1 * (float)local_148._4_4_ + fVar49;
                  local_148._8_4_ =
                       fVar42 * fStack_110 +
                       fVar46 * fStack_120 + fVar1 * (float)local_148._8_4_ + fVar51;
                  fStack_13c = fVar42 * fStack_10c +
                               fVar46 * fStack_11c + fVar1 * fStack_13c + fVar53;
                  fVar1 = (paVar21->mTransformation).c3;
                  fVar46 = (paVar21->mTransformation).d3;
                  fVar42 = fVar46 * local_128;
                  fVar47 = fVar46 * fStack_124;
                  fVar49 = fVar46 * fStack_120;
                  fVar46 = fVar46 * fStack_11c;
                  fVar53 = (paVar21->mTransformation).c4;
                  local_128 = fVar53 * local_118 + fVar1 * local_128 + fVar41 + fVar55;
                  fStack_124 = fVar53 * fStack_114 + fVar1 * fStack_124 + fVar43 + fVar56;
                  fStack_120 = fVar53 * fStack_110 + fVar1 * fStack_120 + fVar44 + fVar57;
                  fStack_11c = fVar53 * fStack_10c + fVar1 * fStack_11c + fVar45 + fVar58;
                  fVar1 = (paVar21->mTransformation).d4;
                  local_118 = local_118 * fVar1 + fVar42 + fVar48 + fVar59;
                  fStack_114 = fStack_114 * fVar1 + fVar47 + fVar50 + fVar60;
                  fStack_110 = fStack_110 * fVar1 + fVar49 + fVar52 + fVar61;
                  fStack_10c = fStack_10c * fVar1 + fVar46 + fVar54 + fVar62;
                  paVar21 = paVar21->mParent;
                } while (paVar21 != (aiNode *)0x0);
              }
              paVar23 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_148);
              fVar41 = paVar23->a1;
              fVar43 = paVar23->a2;
              fVar47 = paVar23->a3;
              fVar44 = paVar23->a4;
              fVar58 = paVar23->b1;
              fVar62 = paVar23->b2;
              fVar54 = paVar23->b3;
              fVar42 = paVar23->b4;
              fVar1 = paVar23->c1;
              fVar46 = paVar23->c2;
              fVar45 = paVar23->c3;
              fVar53 = paVar23->c4;
              paVar21 = *(aiNode **)&paVar23->d3;
              *(undefined8 *)&(local_1b0->mTransformation).d4 = *(undefined8 *)&paVar23->d1;
              local_1b0->mParent = paVar21;
              (local_1b0->mTransformation).c4 = fVar1;
              (local_1b0->mTransformation).d1 = fVar46;
              (local_1b0->mTransformation).d2 = fVar45;
              (local_1b0->mTransformation).d3 = fVar53;
              (local_1b0->mTransformation).b4 = fVar58;
              (local_1b0->mTransformation).c1 = fVar62;
              (local_1b0->mTransformation).c2 = fVar54;
              (local_1b0->mTransformation).c3 = fVar42;
              (local_1b0->mTransformation).a4 = fVar41;
              (local_1b0->mTransformation).b1 = fVar43;
              (local_1b0->mTransformation).b2 = fVar47;
              (local_1b0->mTransformation).b3 = fVar44;
              pSVar24 = local_198.super_BaseProcess.shared;
              pSVar39 = (SharedPostProcessInfo *)local_198.super_BaseProcess._vptr_BaseProcess;
            }
            __src = local_178;
            uVar19 = uVar19 + 1;
          } while (uVar19 < (ulong)(((long)pSVar24 - (long)pSVar39 >> 3) * -0x5555555555555555));
          uVar19 = (long)iStack_170._M_current - (long)local_178 >> 3;
          (_Var36._M_head_impl)->mNumBones = (uint)uVar19;
          if ((long)iStack_170._M_current - (long)local_178 == 0) {
            __dest = (aiBone **)0x0;
          }
          else {
            __dest = (aiBone **)
                     operator_new__(-(ulong)(uVar19 >> 0x3d != 0) |
                                    (long)iStack_170._M_current - (long)local_178);
            memcpy(__dest,__src,(uVar19 + (uVar19 == 0)) * 8);
          }
          (_Var36._M_head_impl)->mBones = __dest;
          if (__src != (void *)0x0) {
            operator_delete(__src,(long)local_168 - (long)__src);
          }
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   *)&local_198);
        uVar31 = local_a0 + 1;
      } while (uVar31 < local_a8->mNumMeshes);
      ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar32 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar19 = local_b0;
    }
    uVar19 = uVar19 + 1;
    if ((ulong)((long)ppaVar32 - (long)ppaVar25 >> 3) <= uVar19) {
      scene->mRootNode = *ppaVar25;
      ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppaVar25) {
        (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppaVar25;
      }
      puVar33 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar26 == puVar33) {
        this_01 = (aiVertexWeight)operator_new(0x10);
        aiMaterial::aiMaterial((aiMaterial *)this_01);
        local_148._0_8_ = this_01;
        std::
        vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
        ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                  (local_160,(unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_148);
        std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                  ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_148);
        puVar33 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar26 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      scene->mNumMaterials = (uint)((ulong)((long)puVar26 - (long)puVar33) >> 3);
      ppaVar27 = unique_to_array<aiMaterial>
                           ((vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                             *)local_160);
      scene->mMaterials = ppaVar27;
      scene->mNumMeshes =
           (uint)((ulong)((long)(this->_meshes).
                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_meshes).
                               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar28 = unique_to_array<aiMesh>(local_158);
      scene->mMeshes = ppaVar28;
      puVar12 = (this->_animations).
                super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)puVar12 -
           (long)(this->_animations).
                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 8) &&
         (uVar19 = (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, uVar19 != 0)) {
        paVar13 = puVar12[-1]._M_t.
                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
        paVar13->mNumChannels = (uint)(uVar19 >> 3);
        ppaVar29 = unique_to_array<aiNodeAnim>(local_b8);
        paVar13->mChannels = ppaVar29;
        scene->mNumAnimations =
             (uint)((ulong)((long)(this->_animations).
                                  super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_animations).
                                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
        ppaVar30 = unique_to_array<aiAnimation>(local_c0);
        scene->mAnimations = ppaVar30;
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_148);
      MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_148,scene);
      FlipWindingOrderProcess::FlipWindingOrderProcess(&local_198);
      FlipWindingOrderProcess::Execute(&local_198,scene);
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_198);
      MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}